

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTestFixture.cpp
# Opt level: O0

uint64_t __thiscall
celero::ThreadTestFixture::run
          (ThreadTestFixture *this,uint64_t threads,uint64_t calls,ExperimentValue *experimentValue)

{
  int iVar1;
  undefined4 extraout_var;
  uint64_t uVar2;
  uint64_t uVar3;
  undefined4 extraout_var_00;
  uint64_t endTime;
  uint64_t startTime;
  ExperimentValue *experimentValue_local;
  uint64_t calls_local;
  uint64_t threads_local;
  ThreadTestFixture *this_local;
  
  iVar1 = (*(this->super_TestFixture)._vptr_TestFixture[0xb])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    (*(this->super_TestFixture)._vptr_TestFixture[6])(this,experimentValue);
    uVar2 = timer::GetSystemTime();
    (*(this->super_TestFixture)._vptr_TestFixture[4])(this,experimentValue);
    (*(this->super_TestFixture)._vptr_TestFixture[0xc])(this,threads,calls);
    (*(this->super_TestFixture)._vptr_TestFixture[0xd])();
    (*(this->super_TestFixture)._vptr_TestFixture[5])();
    uVar3 = timer::GetSystemTime();
    (*(this->super_TestFixture)._vptr_TestFixture[7])();
    this_local = (ThreadTestFixture *)(uVar3 - uVar2);
  }
  else {
    iVar1 = (*(this->super_TestFixture)._vptr_TestFixture[0xb])();
    this_local = (ThreadTestFixture *)CONCAT44(extraout_var_00,iVar1);
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t ThreadTestFixture::run(uint64_t threads, uint64_t calls, const celero::TestFixture::ExperimentValue* const experimentValue)
{
	if(this->HardCodedMeasurement() == 0)
	{
		// Set up the testing fixture.
		this->setUp(experimentValue);

		// Get the starting time.
		const auto startTime = celero::timer::GetSystemTime();

		this->onExperimentStart(experimentValue);

		// Start working threads.
		this->startThreads(threads, calls);

		// Stop working threads.
		this->stopThreads();

		this->onExperimentEnd();

		const auto endTime = celero::timer::GetSystemTime();

		// Tear down the testing fixture.
		this->tearDown();

		// Return the duration in microseconds for the given problem size.
		return (endTime - startTime);
	}

	return this->HardCodedMeasurement();
}